

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

void __thiscall CScript::CScript(CScript *this,opcodetype b)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_CScriptBase)._union + 0x18) = 0;
  (this->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->super_CScriptBase)._union + 8) = 0;
  operator<<(this,b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CScript(opcodetype b)     { operator<<(b); }